

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

void transform_rtvad_aux(List *root,List *code,char (*decls) [5] [1024])

{
  BOOL BVar1;
  char (*__dest) [1024];
  size_t sVar2;
  undefined8 uVar3;
  undefined1 local_d8 [8];
  Token copy_of_t;
  char *name;
  char *s;
  char buf [128];
  Token *t;
  char (*decls_local) [5] [1024];
  List *code_local;
  List *root_local;
  
  if (code != (List *)0x0) {
    buf._120_8_ = &code->token;
    if ((((Token *)buf._120_8_)->type == TOK_TEMP_REGISTER) &&
       (BVar1 = temp_use_consistent(root,(Token *)buf._120_8_), BVar1 != FALSE)) {
      __dest = decls[*(byte *)(buf._120_8_ + 8)] + *(byte *)(buf._120_8_ + 9);
      local_d8 = *(undefined1 (*) [8])buf._120_8_;
      copy_of_t._0_8_ = *(undefined8 *)(buf._120_8_ + 8);
      copy_of_t.u = *(anon_union_8_7_0ba269be_for_u *)(buf._120_8_ + 0x10);
      copy_of_t.filename = *(char **)(buf._120_8_ + 0x18);
      uVar3 = 0x75;
      if (*(char *)(buf._120_8_ + 8) != '\0') {
        uVar3 = 0x73;
      }
      sprintf((char *)&s,"tmp%c%c%d",uVar3,(ulong)(uint)(int)"?bw?l"[*(byte *)(buf._120_8_ + 9)],
              (ulong)*(byte *)(buf._120_8_ + 10));
      copy_of_t.lineno = (unsigned_long)unique_string((char *)&s);
      if ((*__dest)[0] != '\0') {
        strcat(*__dest,",");
      }
      sVar2 = strlen(*__dest);
      sprintf(*__dest + sVar2," %s",copy_of_t.lineno);
      transform_reg_to_var(root,(Token *)local_d8,(char *)copy_of_t.lineno);
    }
    transform_rtvad_aux(root,code->car,decls);
    transform_rtvad_aux(root,code->cdr,decls);
  }
  return;
}

Assistant:

static void
transform_rtvad_aux (List *root, List *code, char decls[2][5][1024])
{
  Token *t;

  /* Recursion base case. */
  if (code == NULL)
    return;

  t = &code->token;
  if (t->type == TOK_TEMP_REGISTER && temp_use_consistent (root, t))
    {
      char buf[128], *s = decls[t->u.reginfo.sgnd][t->u.reginfo.size];
      const char *name;
      Token copy_of_t = *t;

      /* Choose a descriptive + unique name for this new temp variable. */
      sprintf (buf, "tmp%c%c%d", t->u.reginfo.sgnd ? 's' : 'u',
	       "?bw?l"[t->u.reginfo.size], t->u.reginfo.which);
      name = unique_string (buf);

      /* Add this variable's name to the list of variables of this type
       * to declare.
       */
      if (s[0] != '\0')  /* Add a comma if there are previous decls. */
	strcat (s, ",");
      sprintf (s + strlen (s), " %s", name);

      /* Replace all occurrences of this temp register with the temp
       * variable we just made.
       */
      transform_reg_to_var (root, &copy_of_t, name);
    }

  /* Recurse on the rest of the code. */
  transform_rtvad_aux (root, code->car, decls);
  transform_rtvad_aux (root, code->cdr, decls);
}